

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<FileInfoCacheKey,_QFileInfo>::emplace_helper<QFileInfo>
          (QHash<FileInfoCacheKey,_QFileInfo> *this,FileInfoCacheKey *key,QFileInfo *args)

{
  byte bVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  piter pVar4;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_>::
  findOrInsert<FileInfoCacheKey>((InsertionResult *)local_48,this->d,key);
  pEVar2 = (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
          [(uint)local_48._8_8_ & 0x7f];
  if (local_48[0x10] == false) {
    QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>::createInPlace<QFileInfo>
              ((Node<FileInfoCacheKey,_QFileInfo> *)(pEVar2 + bVar1),key,args);
  }
  else {
    QFileInfo::QFileInfo((QFileInfo *)&local_50,args);
    uVar3 = *(undefined8 *)(pEVar2[bVar1].storage.data + 0x38);
    *(undefined8 *)(pEVar2[bVar1].storage.data + 0x38) = local_50;
    local_50 = uVar3;
    QFileInfo::~QFileInfo((QFileInfo *)&local_50);
  }
  pVar4.bucket = local_48._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<FileInfoCacheKey,_QFileInfo>_> *)local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }